

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

string * __thiscall
cmInstallCommand::GetIncludeDestination_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallCommand *this,cmInstallCommandArguments *args)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_INSTALL_INCLUDEDIR",&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"include",&local_5a);
  GetDestination(__return_storage_ptr__,this,args,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCommand::GetIncludeDestination(
  const cmInstallCommandArguments* args)
{
  return this->GetDestination(args, "CMAKE_INSTALL_INCLUDEDIR", "include");
}